

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O3

void buffer_free(buffer_t *buffer)

{
  zip_uint8_t **__ptr;
  ulong uVar1;
  
  if (buffer != (buffer_t *)0x0) {
    __ptr = buffer->fragment;
    if (__ptr != (zip_uint8_t **)0x0) {
      if (buffer->nfragments != 0) {
        uVar1 = 0;
        do {
          free(buffer->fragment[uVar1]);
          uVar1 = uVar1 + 1;
        } while (uVar1 < buffer->nfragments);
        __ptr = buffer->fragment;
      }
      free(__ptr);
    }
    free(buffer);
    return;
  }
  return;
}

Assistant:

static void
buffer_free(buffer_t *buffer) {
    zip_uint64_t i;

    if (buffer == NULL) {
	return;
    }

    if (buffer->fragment) {
	for (i = 0; i < buffer->nfragments; i++) {
	    free(buffer->fragment[i]);
	}
	free(buffer->fragment);
    }
    free(buffer);
}